

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gostsum.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char **in_RSI;
  int in_EDI;
  char sum_1 [65];
  char sum [65];
  int count;
  int failcount;
  char filename [4096];
  char calcsum [65];
  char inhash [65];
  gost_hash_ctx ctx;
  FILE *check_file;
  gost_subst_block *b;
  int open_mode;
  int errors;
  int verbose;
  int i;
  int c;
  char *in_stack_0003ee18;
  int in_stack_0003ee24;
  gost_hash_ctx *in_stack_0003ee28;
  undefined7 in_stack_ffffffffffffee08;
  undefined1 in_stack_ffffffffffffee0f;
  char *in_stack_ffffffffffffee10;
  FILE *in_stack_ffffffffffffee18;
  undefined1 local_1198 [72];
  uint local_1150;
  uint local_114c;
  undefined1 local_1148 [4096];
  char local_148 [80];
  char local_f8 [192];
  FILE *local_38;
  gost_subst_block *local_30;
  undefined4 local_24;
  uint local_20;
  int local_1c;
  int local_18;
  int local_14;
  char **local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_1c = 0;
  local_20 = 0;
  local_24 = 0;
  local_30 = &GostR3411_94_CryptoProParamSet;
  local_38 = (FILE *)0x0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_14 = getopt(local_8,local_10,"bc::tv"), local_14 != -1) {
    in_stack_ffffffffffffee10 = (char *)(ulong)(local_14 - 0x62);
    switch(in_stack_ffffffffffffee10) {
    case (char *)0x0:
      break;
    case (char *)0x1:
      if (_optarg == (char *)0x0) {
        local_38 = _stdin;
      }
      else {
        local_38 = fopen(_optarg,"r");
        if (local_38 == (FILE *)0x0) {
          perror(_optarg);
          exit(2);
        }
      }
      break;
    default:
      fprintf(_stderr,"invalid option %c",(ulong)_optopt);
      help();
      break;
    case (char *)0x12:
      local_30 = &GostR3411_94_TestParamSet;
      break;
    case (char *)0x14:
      local_1c = 1;
    }
  }
  init_gost_hash_ctx((gost_hash_ctx *)CONCAT17(in_stack_ffffffffffffee0f,in_stack_ffffffffffffee08),
                     (gost_subst_block *)0x101456);
  if (local_38 == (FILE *)0x0) {
    if (_optind != local_8) {
      for (local_18 = _optind; local_18 < local_8; local_18 = local_18 + 1) {
        iVar1 = hash_file((gost_hash_ctx *)in_stack_ffffffffffffee18,in_stack_ffffffffffffee10,
                          (char *)CONCAT17(in_stack_ffffffffffffee0f,in_stack_ffffffffffffee08),0);
        if (iVar1 == 0) {
          local_20 = local_20 + 1;
        }
        else {
          printf("%s %s\n",&stack0xffffffffffffee18,local_10[local_18]);
        }
      }
      exit((uint)(local_20 != 0));
    }
    fileno(_stdin);
    iVar1 = hash_stream(in_stack_0003ee28,in_stack_0003ee24,in_stack_0003ee18);
    if (iVar1 == 0) {
      perror("stdin");
      exit(1);
    }
    printf("%s -\n",local_1198);
    exit(0);
  }
  local_114c = 0;
  local_1150 = 0;
  local_20 = 0;
  if (((local_38 == _stdin) && (_optind < local_8)) &&
     (local_38 = fopen(local_10[_optind],"r"), local_38 == (FILE *)0x0)) {
    perror(local_10[_optind]);
    exit(2);
  }
  while (iVar1 = get_line(in_stack_ffffffffffffee18,in_stack_ffffffffffffee10,
                          (char *)CONCAT17(in_stack_ffffffffffffee0f,in_stack_ffffffffffffee08)),
        iVar1 != 0) {
    local_1150 = local_1150 + 1;
    iVar1 = hash_file((gost_hash_ctx *)in_stack_ffffffffffffee18,in_stack_ffffffffffffee10,
                      (char *)CONCAT17(in_stack_ffffffffffffee0f,in_stack_ffffffffffffee08),0);
    if (iVar1 == 0) {
      local_20 = local_20 + 1;
    }
    else {
      iVar1 = strncmp(local_148,local_f8,0x41);
      if (iVar1 == 0) {
        if (local_1c != 0) {
          fprintf(_stderr,"%s\tOK\n",local_1148);
        }
      }
      else {
        if (local_1c == 0) {
          fprintf(_stderr,"%s: GOST hash sum check failed for \'%s\'\n",*local_10,local_1148);
        }
        else {
          fprintf(_stderr,"%s\tFAILED\n",local_1148);
        }
        local_114c = local_114c + 1;
      }
    }
  }
  if (local_20 != 0) {
    fprintf(_stderr,"%s: WARNING %d of %d file(s) cannot be processed\n",*local_10,(ulong)local_20,
            (ulong)local_1150);
  }
  if ((local_1c != 0) && (local_114c != 0)) {
    fprintf(_stderr,"%s: %d of %d file(f) failed GOST hash sum check\n",*local_10,(ulong)local_114c,
            (ulong)local_1150);
  }
  exit((uint)(local_114c != 0 || local_20 != 0));
}

Assistant:

int main(int argc, char **argv)
{
    int c, i;
    int verbose = 0;
    int errors = 0;
    int open_mode = O_RDONLY;
    gost_subst_block *b = &GostR3411_94_CryptoProParamSet;
    FILE *check_file = NULL;
    gost_hash_ctx ctx;

    while ((c = getopt(argc, argv, "bc::tv")) != -1) {
        switch (c) {
        case 'v':
            verbose = 1;
            break;
        case 't':
            b = &GostR3411_94_TestParamSet;
            break;
        case 'b':
            open_mode |= O_BINARY;
            break;
        case 'c':
            if (optarg) {
                check_file = fopen(optarg, "r");
                if (!check_file) {
                    perror(optarg);
                    exit(2);
                }
            } else {
                check_file = stdin;
            }
            break;
        default:
            fprintf(stderr, "invalid option %c", optopt);
            help();
        }
    }
    init_gost_hash_ctx(&ctx, b);
    if (check_file) {
        char inhash[65], calcsum[65], filename[PATH_MAX];
        int failcount = 0, count = 0;
        errors = 0;
        if (check_file == stdin && optind < argc) {
            check_file = fopen(argv[optind], "r");
            if (!check_file) {
                perror(argv[optind]);
                exit(2);
            }
        }
        while (get_line(check_file, inhash, filename)) {
            count++;
            if (!hash_file(&ctx, filename, calcsum, open_mode)) {
                errors++;
                continue;
            }
            if (strncmp(calcsum, inhash, 65) == 0) {
                if (verbose) {
                    fprintf(stderr, "%s\tOK\n", filename);
                }
            } else {
                if (verbose) {
                    fprintf(stderr, "%s\tFAILED\n", filename);
                } else {
                    fprintf(stderr,
                            "%s: GOST hash sum check failed for '%s'\n",
                            argv[0], filename);
                }
                failcount++;
            }
        }
        if (errors) {
            fprintf(stderr,
                    "%s: WARNING %d of %d file(s) cannot be processed\n",
                    argv[0], errors, count);

        }
        if (verbose && failcount) {
            fprintf(stderr,
                    "%s: %d of %d file(f) failed GOST hash sum check\n",
                    argv[0], failcount, count);
        }
        exit((failcount || errors) ? 1 : 0);
    }
    if (optind == argc) {
        char sum[65];
#ifdef _WIN32
        if (open_mode & O_BINARY) {
            _setmode(fileno(stdin), O_BINARY);
        }
#endif
        if (!hash_stream(&ctx, fileno(stdin), sum)) {
            perror("stdin");
            exit(1);
        }
        printf("%s -\n", sum);
        exit(0);
    }
    for (i = optind; i < argc; i++) {
        char sum[65];
        if (!hash_file(&ctx, argv[i], sum, open_mode)) {
            errors++;
        } else {
            printf("%s %s\n", sum, argv[i]);
        }
    }
    exit(errors ? 1 : 0);
}